

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

string * __thiscall
cs222::Pass2::calculateDisp_abi_cxx11_
          (string *__return_storage_ptr__,Pass2 *this,int address,Instruction *instruction,
          char *flags)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  undefined1 local_a8 [8];
  string binaryString;
  string local_68 [34];
  byte local_46;
  allocator local_45 [16];
  allocator local_35;
  int local_34;
  char *pcStack_30;
  int disp;
  char *flags_local;
  Instruction *instruction_local;
  Pass2 *pPStack_18;
  int address_local;
  Pass2 *this_local;
  string *objCode;
  
  pcStack_30 = flags;
  flags_local = (char *)instruction;
  instruction_local._4_4_ = address;
  pPStack_18 = this;
  this_local = (Pass2 *)__return_storage_ptr__;
  sVar2 = Instruction::getAddress(instruction);
  local_34 = address - ((int)sVar2 + 3);
  if ((0x7ff < local_34) || (local_34 < -0x800)) {
    if (this->base == -0x80000000) {
      std::__cxx11::string::operator=
                ((string *)&this->errorReportMessage,"Base register is empty!!");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_45);
      std::allocator<char>::~allocator((allocator<char> *)local_45);
      return __return_storage_ptr__;
    }
    pcStack_30[3] = '1';
    pcStack_30[4] = '0';
    local_34 = instruction_local._4_4_ - this->base;
    if ((local_34 < 0) || (0x1000 < local_34)) {
      std::__cxx11::string::operator=((string *)&this->errorReportMessage,"Disp is out of range");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_35);
      std::allocator<char>::~allocator((allocator<char> *)&local_35);
      return __return_storage_ptr__;
    }
  }
  local_46 = 0;
  decimalToHex_abi_cxx11_(__return_storage_ptr__,this,local_34);
  uVar3 = std::__cxx11::string::length();
  if (uVar3 < 4) {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 < 3) {
      cVar1 = std::__cxx11::string::size();
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x03' - cVar1);
    }
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_68,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_68);
    std::__cxx11::string::~string(local_68);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&binaryString.field_2 + 8),"DISPLACEMENT: ",__return_storage_ptr__);
  logDebug((string *)((long)&binaryString.field_2 + 8));
  std::__cxx11::string::~string((string *)(binaryString.field_2._M_local_buf + 8));
  Instruction::getOperation_abi_cxx11_((string *)local_c8,(Instruction *)flags_local);
  cVar1 = getOpcode((string *)local_c8);
  charToBinStr_abi_cxx11_((string *)local_a8,this,cVar1);
  std::__cxx11::string::~string((string *)local_c8);
  for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   pcStack_30[local_cc]);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::string((string *)&local_150,(string *)local_a8);
  binaryToHex(&local_130,this,&local_150);
  std::operator+(&local_110,&local_130,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  local_46 = 1;
  std::__cxx11::string::~string((string *)local_a8);
  if ((local_46 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::calculateDisp(int address,Instruction &instruction, char flags[6])
    {
        int disp = address - (instruction.getAddress()+3);
        if (disp > 2047 || disp < -2048)
        {
            //use base relative
            if (base != INT_MIN)
            {
                flags[3] = '1';
                flags[4] = '0';
                disp = address - base;
                if (disp < 0 || disp > 4096)
                {
                    errorReportMessage = "Disp is out of range";
                    return "";
                }

            }else
            {
                errorReportMessage = "Base register is empty!!";
                return "";
            }
        }
        std::string objCode = decimalToHex(disp);
        if (objCode.length() > 3) objCode = objCode.substr(objCode.length() - 3,3);
        else if (objCode.length() < 3) objCode.insert(0,3-objCode.size(),'0');
        logDebug("DISPLACEMENT: " + objCode);

        std::string binaryString = charToBinStr(getOpcode(instruction.getOperation()));
        for (int i = 0; i < 6; ++i) {
            binaryString = binaryString + flags[i];
        }
        objCode = binaryToHex(binaryString) + objCode;
        return objCode;
    }